

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

void xfer_download_queue(fxp_xfer *xfer)

{
  req *prVar1;
  int iVar2;
  req *prVar3;
  char *pcVar4;
  sftp_request *psVar5;
  req **pprVar6;
  
  iVar2 = xfer->req_totalsize;
  while (((iVar2 < xfer->req_maxsize && (xfer->eof == false)) && (xfer->err == false))) {
    prVar3 = (req *)safemalloc(1,0x30,0);
    prVar3->offset = xfer->offset;
    prVar3->complete = 0;
    prVar1 = xfer->tail;
    pprVar6 = &prVar1->next;
    if (prVar1 == (req *)0x0) {
      pprVar6 = &xfer->head;
    }
    *pprVar6 = prVar3;
    prVar3->prev = prVar1;
    xfer->tail = prVar3;
    prVar3->next = (req *)0x0;
    prVar3->len = 0x8000;
    pcVar4 = (char *)safemalloc(0x8000,1,0);
    prVar3->buffer = pcVar4;
    psVar5 = fxp_read_send(xfer->fh,prVar3->offset,prVar3->len);
    psVar5->registered = true;
    psVar5->userdata = prVar3;
    iVar2 = prVar3->len;
    xfer->offset = xfer->offset + (long)iVar2;
    iVar2 = xfer->req_totalsize + iVar2;
    xfer->req_totalsize = iVar2;
  }
  return;
}

Assistant:

void xfer_download_queue(struct fxp_xfer *xfer)
{
    while (xfer->req_totalsize < xfer->req_maxsize &&
           !xfer->eof && !xfer->err) {
        /*
         * Queue a new read request.
         */
        struct req *rr;
        struct sftp_request *req;

        rr = snew(struct req);
        rr->offset = xfer->offset;
        rr->complete = 0;
        if (xfer->tail) {
            xfer->tail->next = rr;
            rr->prev = xfer->tail;
        } else {
            xfer->head = rr;
            rr->prev = NULL;
        }
        xfer->tail = rr;
        rr->next = NULL;

        rr->len = 32768;
        rr->buffer = snewn(rr->len, char);
        sftp_register(req = fxp_read_send(xfer->fh, rr->offset, rr->len));
        fxp_set_userdata(req, rr);

        xfer->offset += rr->len;
        xfer->req_totalsize += rr->len;

#ifdef DEBUG_DOWNLOAD
        printf("queueing read request %p at %"PRIu64"\n", rr, rr->offset);
#endif
    }
}